

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::ReportInvalidTestSuiteType
               (char *test_suite_name,CodeLocation *code_location)

{
  Message *pMVar1;
  ostream *poVar2;
  int line;
  GTestLog local_64;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  char *test_suite_name_local;
  string local_50;
  string local_30;
  
  test_suite_name_local = test_suite_name;
  Message::Message((Message *)&local_60);
  std::operator<<((ostream *)(local_60._M_head_impl + 0x10),"Attempted redefinition of test suite ")
  ;
  pMVar1 = Message::operator<<((Message *)&local_60,&test_suite_name_local);
  pMVar1 = Message::operator<<(pMVar1,(char (*) [3])0x142ef0);
  pMVar1 = Message::operator<<(pMVar1,(char (*) [65])
                                      "All tests in the same test suite must use the same test fixture\n"
                              );
  pMVar1 = Message::operator<<(pMVar1,(char (*) [32])"class.  However, in test suite ");
  pMVar1 = Message::operator<<(pMVar1,&test_suite_name_local);
  pMVar1 = Message::operator<<(pMVar1,(char (*) [13])", you tried\n");
  pMVar1 = Message::operator<<(pMVar1,(char (*) [63])
                                      "to define a test using a fixture class different from the one\n"
                              );
  pMVar1 = Message::operator<<(pMVar1,(char (*) [62])
                                      "used earlier. This can happen if the two fixture classes are\n"
                              );
  pMVar1 = Message::operator<<(pMVar1,(char (*) [62])
                                      "from different namespaces and have the same name. You should\n"
                              );
  pMVar1 = Message::operator<<(pMVar1,(char (*) [68])
                                      "probably rename one of the classes to put the tests into different\n"
                              );
  Message::operator<<(pMVar1,(char (*) [13])0x142c29);
  line = 0xafc;
  GTestLog::GTestLog(&local_64,GTEST_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/ThirdParty/googletest/googletest/src/gtest.cc"
                     ,0xafc);
  FormatFileLocation_abi_cxx11_
            (&local_30,(internal *)(code_location->file)._M_dataplus._M_p,
             (char *)(ulong)(uint)code_location->line,line);
  poVar2 = std::operator<<((ostream *)&std::cerr,(string *)&local_30);
  poVar2 = std::operator<<(poVar2," ");
  StringStreamToString(&local_50,local_60._M_head_impl);
  std::operator<<(poVar2,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  GTestLog::~GTestLog(&local_64);
  if (local_60._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)local_60._M_head_impl + 8))();
  }
  return;
}

Assistant:

void ReportInvalidTestSuiteType(const char* test_suite_name,
                                const CodeLocation& code_location) {
  Message errors;
  errors
      << "Attempted redefinition of test suite " << test_suite_name << ".\n"
      << "All tests in the same test suite must use the same test fixture\n"
      << "class.  However, in test suite " << test_suite_name << ", you tried\n"
      << "to define a test using a fixture class different from the one\n"
      << "used earlier. This can happen if the two fixture classes are\n"
      << "from different namespaces and have the same name. You should\n"
      << "probably rename one of the classes to put the tests into different\n"
      << "test suites.";

  GTEST_LOG_(ERROR) << FormatFileLocation(code_location.file.c_str(),
                                          code_location.line)
                    << " " << errors.GetString();
}